

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O2

int kvtree_exchange_direction_hops
              (kvtree *hash_in,kvtree *hash_out,MPI_Comm comm,kvtree_exchange_enum direction,
              int hops)

{
  int iVar1;
  kvtree *pkVar2;
  kvtree_elem *pkVar3;
  kvtree *pkVar4;
  kvtree *pkVar5;
  uint uVar6;
  int iVar7;
  int rank_send;
  int rank;
  int ranks;
  kvtree *current;
  kvtree *recv;
  kvtree *send;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  kvtree *local_48;
  kvtree *local_40;
  MPI_Comm local_38;
  
  local_5c = hops;
  local_40 = hash_out;
  MPI_Comm_rank(comm,&rank);
  local_38 = comm;
  MPI_Comm_size(comm,&ranks);
  pkVar2 = kvtree_new();
  current = pkVar2;
  for (pkVar3 = kvtree_elem_first(hash_in); pkVar3 != (kvtree_elem *)0x0;
      pkVar3 = kvtree_elem_next(pkVar3)) {
    iVar1 = kvtree_elem_key_int(pkVar3);
    pkVar4 = kvtree_elem_hash(pkVar3);
    pkVar5 = kvtree_set_kv_int(pkVar2,"D",iVar1);
    pkVar5 = kvtree_set_kv_int(pkVar5,"S",rank);
    kvtree_merge(pkVar5,pkVar4);
  }
  iVar1 = 1;
  iVar7 = 0;
  uVar6 = 1;
  while( true ) {
    if ((ranks <= iVar1) || (-1 < local_5c && local_5c <= iVar7)) break;
    rank_send = (rank - iVar1 >> 0x1f & ranks) + (rank - iVar1);
    local_54 = ranks;
    if (rank + iVar1 < ranks) {
      local_54 = 0;
    }
    local_54 = (rank + iVar1) - local_54;
    local_58 = local_54;
    if (direction == KVTREE_EXCHANGE_RIGHT) {
      local_58 = rank_send;
    }
    local_50 = iVar7;
    local_4c = iVar1;
    local_48 = kvtree_new();
    send = kvtree_new();
    recv = kvtree_new();
    pkVar2 = kvtree_get(current,"D");
    for (pkVar3 = kvtree_elem_first(pkVar2); pkVar3 != (kvtree_elem *)0x0;
        pkVar3 = kvtree_elem_next(pkVar3)) {
      iVar1 = kvtree_elem_key_int(pkVar3);
      pkVar2 = kvtree_elem_hash(pkVar3);
      if (iVar1 - rank == 0) {
        pkVar2 = kvtree_get(pkVar2,"S");
        pkVar4 = local_40;
      }
      else {
        iVar7 = rank - iVar1;
        if (direction == KVTREE_EXCHANGE_RIGHT) {
          iVar7 = iVar1 - rank;
        }
        pkVar4 = local_48;
        if (((iVar7 >> 0x1f & ranks) + iVar7 & uVar6) != 0) {
          pkVar4 = send;
        }
        pkVar4 = kvtree_set_kv_int(pkVar4,"D",iVar1);
      }
      kvtree_merge(pkVar4,pkVar2);
    }
    if (direction == KVTREE_EXCHANGE_RIGHT) {
      rank_send = local_54;
    }
    kvtree_sendrecv(send,rank_send,recv,local_58,local_38);
    pkVar2 = local_48;
    kvtree_merge(local_48,recv);
    kvtree_delete(&current);
    current = pkVar2;
    kvtree_delete(&recv);
    kvtree_delete(&send);
    uVar6 = uVar6 * 2;
    iVar1 = local_4c * 2;
    iVar7 = local_50 + 1;
  }
  pkVar2 = kvtree_get_kv_int(current,"D",rank);
  pkVar2 = kvtree_get(pkVar2,"S");
  kvtree_merge(local_40,pkVar2);
  iVar1 = kvtree_delete(&current);
  return iVar1;
}

Assistant:

static int kvtree_exchange_direction_hops(
  const kvtree* hash_in,
        kvtree* hash_out,
  MPI_Comm comm,
  kvtree_exchange_enum direction,
  int hops)
{
  kvtree_elem* elem;

  /* get the size of our communicator and our position within it */
  int rank, ranks;
  MPI_Comm_rank(comm, &rank);
  MPI_Comm_size(comm, &ranks);

  /* set up current hash using input hash */
  kvtree* current = kvtree_new();
  for (elem = kvtree_elem_first(hash_in);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get destination rank */
    int dest_rank = kvtree_elem_key_int(elem);

    /* copy data into current hash with DEST and SRC keys */
    kvtree* data_hash = kvtree_elem_hash(elem);
    kvtree* dest_hash = kvtree_set_kv_int(current,   "D", dest_rank);
    kvtree* src_hash  = kvtree_set_kv_int(dest_hash, "S", rank);
    kvtree_merge(src_hash, data_hash);
  }

  /* now run through Bruck's index algorithm to exchange data,
   * if hops is positive we can stop after that many steps */
  int bit = 1;
  int step = 1;
  int hop_count = 0;
  while (step < ranks && (hops < 0 || hop_count < hops)) {
    /* compute left and right ranks for this step */
    int left = rank - step;
    if (left < 0) {
      left += ranks;
    }
    int right = rank + step;
    if (right >= ranks) {
      right -= ranks;
    }

    /* determine source and destination ranks for this step */
    int dst, src;
    if (direction == KVTREE_EXCHANGE_RIGHT) {
      /* send to the right */
      dst = right;
      src = left;
    } else {
      /* send to the left */
      dst = left;
      src = right;
    }

    /* create hashes for those we'll keep, send, and receive */
    kvtree* keep = kvtree_new();
    kvtree* send = kvtree_new();
    kvtree* recv = kvtree_new();

    /* identify hashes we'll send and keep in this step */
    kvtree* dest_hash = kvtree_get(current, "D");
    for (elem = kvtree_elem_first(dest_hash);
         elem != NULL;
         elem = kvtree_elem_next(elem))
    {
      /* get destination rank and pointer to its hash */
      int dest_rank = kvtree_elem_key_int(elem);
      kvtree* elem_hash = kvtree_elem_hash(elem);

      /* compute relative distance from our rank */
      int dist;
      if (direction == KVTREE_EXCHANGE_RIGHT) {
        dist = dest_rank - rank;
      } else {
        dist = rank - dest_rank;
      }
      if (dist < 0) {
        dist += ranks;
      }

      /* copy item to send, keep, or output hash */
      if (dest_rank == rank) {
        /* we are the destination for this item, discard SRC key
         * and copy hash to output hash */
        kvtree* dest_hash = kvtree_get(elem_hash, "S");
        kvtree_merge(hash_out, dest_hash);
      } else if (dist & bit) {
        /* we send the hash if the bit is set */
        kvtree* dest_send = kvtree_set_kv_int(send, "D", dest_rank);
        kvtree_merge(dest_send, elem_hash);
      } else {
        /* otherwise, copy hash to keep */
        kvtree* dest_keep = kvtree_set_kv_int(keep, "D", dest_rank);
        kvtree_merge(dest_keep, elem_hash);
      }
    }

    /* exchange hashes with our partners */
    kvtree_sendrecv(send, dst, recv, src, comm);

    /* merge received hash into keep */
    kvtree_merge(keep, recv);

    /* delete current hash and point it to keep instead */
    kvtree_delete(&current);
    current = keep;

    /* prepare for next rount */
    kvtree_delete(&recv);
    kvtree_delete(&send);
    bit <<= 1;
    step *= 2;
    hop_count++;
  }

  /* TODO: check that all items are really destined for this rank */

  /* copy current into output hash */
  kvtree* dest_hash = kvtree_get_kv_int(current, "D", rank);
  kvtree* elem_hash = kvtree_get(dest_hash, "S");
  kvtree_merge(hash_out, elem_hash);

  /* free the current hash */
  kvtree_delete(&current);

  return KVTREE_SUCCESS;
}